

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

CallArgHandler __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCall
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int func_index,
          int num_args)

{
  SafeBool SVar1;
  undefined8 uVar2;
  int in_ESI;
  Error *in_RDI;
  CallExprBuilder CVar3;
  CallArgHandler CVar4;
  Function func;
  BasicExprFactory<std::allocator<char>_> *in_stack_ffffffffffffffa8;
  BasicCStringRef<char> local_48;
  undefined8 in_stack_ffffffffffffffc0;
  int num_args_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  Function local_28;
  CStringRef in_stack_fffffffffffffff0;
  
  num_args_00 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_28 = BasicExprFactory<std::allocator<char>_>::function
                       (in_stack_ffffffffffffffa8,(int)((ulong)in_RDI >> 0x20));
  SVar1 = Function::operator_cast_to_function_pointer(&local_28);
  if (SVar1 != 0) {
    CVar3 = BasicExprFactory<std::allocator<char>_>::BeginCall
                      ((BasicExprFactory<std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),local_28,
                       num_args_00);
    CVar4._12_4_ = 0;
    CVar4.impl_ = (Impl *)SUB128(CVar3._0_12_,0);
    CVar4.arg_index_ = SUB124(CVar3._0_12_,8);
    return CVar4;
  }
  uVar2 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_48,"function {} is not defined");
  Error::Error(in_RDI,in_stack_fffffffffffffff0,in_ESI);
  __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

CallArgHandler BeginCall(int func_index, int num_args) {
    // Check if the function is defined.
    if (Function func = builder_.function(func_index))
      return builder_.BeginCall(func, num_args);
    throw Error("function {} is not defined", func_index);
  }